

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>
          (PromiseDisposer *this,WeakFulfiller<capnp::AnyPointer::Pipeline> *params)

{
  void *pvVar1;
  WeakFulfiller<capnp::AnyPointer::Pipeline> *params_00;
  PromiseArena *arena;
  AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
  *ptr;
  WeakFulfiller<capnp::AnyPointer::Pipeline> *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>(params);
  ctor<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>,kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>
            ((AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
              *)((long)pvVar1 + 0x200),params_00);
  *(void **)((long)pvVar1 + 0x208) = pvVar1;
  Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>,_kj::_::PromiseDisposer>
  ::Own((Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>,_kj::_::PromiseDisposer>
         *)this,(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
                 *)((long)pvVar1 + 0x200));
  return (Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }